

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O3

bool __thiscall
basisu::vector<basist::ktx2_transcoder::key_value>::try_reserve
          (vector<basist::ktx2_transcoder::key_value> *this,size_t new_capacity_size_t)

{
  ulong uVar1;
  void *pvVar2;
  bool bVar3;
  key_value *__ptr;
  uint min_new_capacity;
  long lVar4;
  vector<basist::ktx2_transcoder::key_value> local_28;
  
  if (new_capacity_size_t >> 0x20 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                  ,0x1fa,
                  "bool basisu::vector<basist::ktx2_transcoder::key_value>::try_reserve(size_t) [T = basist::ktx2_transcoder::key_value]"
                 );
  }
  min_new_capacity = (uint)new_capacity_size_t;
  if (this->m_capacity < min_new_capacity) {
    bVar3 = elemental_vector::increase_capacity
                      ((elemental_vector *)this,min_new_capacity,false,0x20,object_mover,false);
    if (!bVar3) {
      return false;
    }
  }
  else if (min_new_capacity < this->m_capacity) {
    local_28.m_p = (key_value *)0x0;
    local_28.m_size = 0;
    local_28.m_capacity = 0;
    if (min_new_capacity < this->m_size) {
      min_new_capacity = this->m_size;
    }
    elemental_vector::increase_capacity
              ((elemental_vector *)&local_28,min_new_capacity,false,0x20,object_mover,false);
    operator=(&local_28,this);
    __ptr = this->m_p;
    this->m_p = local_28.m_p;
    uVar1._0_4_ = this->m_size;
    uVar1._4_4_ = this->m_capacity;
    this->m_size = local_28.m_size;
    this->m_capacity = local_28.m_capacity;
    local_28.m_size = (undefined4)uVar1;
    local_28.m_capacity = uVar1._4_4_;
    local_28.m_p = __ptr;
    if (__ptr != (key_value *)0x0) {
      if ((undefined4)uVar1 != 0) {
        lVar4 = 0;
        do {
          pvVar2 = *(void **)((long)&(__ptr->m_value).m_p + lVar4);
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
          pvVar2 = *(void **)((long)&(__ptr->m_key).m_p + lVar4);
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
          lVar4 = lVar4 + 0x20;
        } while ((uVar1 & 0xffffffff) << 5 != lVar4);
        __ptr = local_28.m_p;
      }
      free(__ptr);
    }
  }
  return true;
}

Assistant:

inline bool try_reserve(size_t new_capacity_size_t)
      {
         if (new_capacity_size_t > UINT32_MAX)
         {
            assert(0);
            return false;
         }

         uint32_t new_capacity = (uint32_t)new_capacity_size_t;

         if (new_capacity > m_capacity)
         {
            if (!increase_capacity(new_capacity, false))
               return false;
         }
         else if (new_capacity < m_capacity)
         {
            // Must work around the lack of a "decrease_capacity()" method.
            // This case is rare enough in practice that it's probably not worth implementing an optimized in-place resize.
            vector tmp;
            tmp.increase_capacity(helpers::maximum(m_size, new_capacity), false);
            tmp = *this;
            swap(tmp);
         }

         return true;
      }